

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O0

void __thiscall Assimp::IRRImporter::SetupProperties(IRRImporter *this,Importer *pImp)

{
  int iVar1;
  Logger *this_00;
  Importer *pImp_local;
  IRRImporter *this_local;
  
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_IRR_ANIM_FPS",100);
  this->fps = (double)iVar1;
  if (this->fps <= 10.0 && this->fps != 10.0) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"IRR: Invalid FPS configuration");
    this->fps = 100.0;
  }
  iVar1 = Importer::GetPropertyInteger(pImp,"FAVOUR_SPEED",0);
  this->configSpeedFlag = iVar1 != 0;
  return;
}

Assistant:

void IRRImporter::SetupProperties(const Importer* pImp)
{
    // read the output frame rate of all node animation channels
    fps = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_IRR_ANIM_FPS,100);
    if (fps < 10.)  {
        ASSIMP_LOG_ERROR("IRR: Invalid FPS configuration");
        fps = 100;
    }

    // AI_CONFIG_FAVOUR_SPEED
    configSpeedFlag = (0 != pImp->GetPropertyInteger(AI_CONFIG_FAVOUR_SPEED,0));
}